

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v5::vprint_rgb(v5 *this,rgb fd,string_view format,format_args args)

{
  string_view format_str;
  undefined5 in_register_00000033;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  local_68;
  char *local_58;
  char *local_50;
  char local_48 [8];
  char escape_fd [20];
  format_args args_local;
  string_view format_local;
  rgb fd_local;
  
  register0x00000008 = format.size_;
  builtin_strncpy(local_48,"\x1b[38;2;0",8);
  builtin_strncpy(escape_fd,"00;000;000m",0xc);
  format_local.size_._5_1_ = (uint8_t)this;
  internal::to_esc(format_local.size_._5_1_,local_48,7);
  format_local.size_._6_1_ = (uint8_t)((ulong)this >> 8);
  internal::to_esc(format_local.size_._6_1_,local_48,0xb);
  internal::to_esc((uint8_t)((ulong)this >> 0x10),local_48,0xf);
  fputs(local_48,_stdout);
  local_58 = (char *)CONCAT53(in_register_00000033,fd);
  local_50 = format.data_;
  format_args::format_args<fmt::v5::format_args&>
            ((format_args *)&local_68,(format_args *)(escape_fd + 0x10));
  format_str.size_ = (size_t)local_50;
  format_str.data_ = local_58;
  vprint(format_str,(format_args)local_68);
  fputs("\x1b[0m",_stdout);
  return;
}

Assistant:

FMT_FUNC void vprint_rgb(rgb fd, string_view format, format_args args) {
  char escape_fd[] = "\x1b[38;2;000;000;000m";
  internal::to_esc(fd.r, escape_fd, 7);
  internal::to_esc(fd.g, escape_fd, 11);
  internal::to_esc(fd.b, escape_fd, 15);

  std::fputs(escape_fd, stdout);
  vprint(format, args);
  std::fputs(internal::data::RESET_COLOR, stdout);
}